

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuThreads.cpp
# Opt level: O2

void __thiscall xmrig::CpuThreads::CpuThreads(CpuThreads *this,Value *value)

{
  uint16_t uVar1;
  ushort uVar2;
  uint uVar3;
  uint intensity;
  uint uVar4;
  Value *pVVar5;
  Number NVar6;
  ulong uVar7;
  int __base;
  size_t i;
  ulong uVar8;
  ulong uVar9;
  ulong affinity;
  long lVar10;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *v;
  Value *pVVar11;
  CpuThread thread;
  
  this->m_format = ArrayFormat;
  this->m_affinity = -1;
  (this->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar1 = (value->data_).f.flags;
  if (uVar1 == 3) {
    intensity = Json::getUint(value,"intensity",1);
    uVar4 = Json::getUint(value,"threads",0);
    uVar3 = 0x400;
    if (uVar4 < 0x400) {
      uVar3 = uVar4;
    }
    pVVar11 = Json::getValue(value,"affinity");
    uVar2 = (pVVar11->data_).f.flags;
    if ((char)uVar2 < '\0') {
      NVar6 = (pVVar11->data_).n;
    }
    else if ((uVar2 >> 10 & 1) == 0) {
      NVar6.i64 = -1;
    }
    else {
      if ((uVar2 >> 0xc & 1) == 0) {
        pVVar11 = (Value *)((ulong)(pVVar11->data_).s.str & 0xffffffffffff);
      }
      pVVar5 = (Value *)strstr((char *)pVVar11,"0x");
      if (pVVar5 == (Value *)0x0) {
        __base = 10;
      }
      else {
        __base = 0x10;
        pVVar11 = pVVar5;
      }
      NVar6.i64 = strtoll((char *)pVVar11,(char **)0x0,__base);
    }
    this->m_affinity = (int64_t)NVar6;
    this->m_format = ObjectFormat;
    if (intensity - 6 < 0xfffffffb) {
      intensity = 1;
    }
    for (uVar8 = 0; uVar8 != uVar3; uVar8 = uVar8 + 1) {
      affinity = 0xffffffffffffffff;
      if (this->m_affinity != 0xffffffffffffffff) {
        uVar7 = 0;
        for (uVar9 = 0; affinity = 0xffffffffffffffff, uVar9 != 0x40; uVar9 = uVar9 + 1) {
          if (((ulong)this->m_affinity >> (uVar9 & 0x3f) & 1) != 0) {
            affinity = uVar9;
            if (uVar7 == uVar8) break;
            uVar7 = uVar7 + 1;
          }
        }
      }
      add(this,affinity,intensity);
    }
  }
  else if (uVar1 == 4) {
    pVVar11 = (Value *)((ulong)(value->data_).s.str & 0xffffffffffff);
    for (lVar10 = (ulong)(value->data_).s.length << 4; lVar10 != 0; lVar10 = lVar10 + -0x10) {
      CpuThread::CpuThread(&thread,pVVar11);
      if (thread.m_intensity < 6) {
        std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>::push_back
                  (&this->m_data,&thread);
      }
      pVVar11 = pVVar11 + 1;
    }
  }
  return;
}

Assistant:

xmrig::CpuThreads::CpuThreads(const rapidjson::Value &value)
{
    if (value.IsArray()) {
        for (auto &v : value.GetArray()) {
            CpuThread thread(v);
            if (thread.isValid()) {
                add(std::move(thread));
            }
        }
    }
    else if (value.IsObject()) {
        uint32_t intensity   = Json::getUint(value, kIntensity, 1);
        const size_t threads = std::min<unsigned>(Json::getUint(value, kThreads), 1024);
        m_affinity           = getAffinityMask(Json::getValue(value, kAffinity));
        m_format             = ObjectFormat;

        if (intensity < 1 || intensity > 5) {
            intensity = 1;
        }

        for (size_t i = 0; i < threads; ++i) {
            add(getAffinity(i, m_affinity), intensity);
        }
    }
}